

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O0

void * coll_seq_insert_after(coll_seq_t *seq,void *data,void *pos)

{
  coll_seq_node_t *pcVar1;
  node_t_conflict *node;
  node_t_conflict *cur;
  void *pos_local;
  void *data_local;
  coll_seq_t *seq_local;
  
  if (seq != (coll_seq_t *)0x0) {
    for (node = seq->head; node != (node_t_conflict *)0x0; node = node->next) {
      if (node->data == pos) {
        pcVar1 = (coll_seq_node_t *)malloc(0x10);
        pcVar1->data = data;
        pcVar1->next = node->next;
        node->next = pcVar1;
        seq->len = seq->len + 1;
        return data;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *coll_seq_insert_after(coll_seq_t *seq, void *data, void *pos) {
    if (!seq) {
        return NULL;
    }
    node_t *cur = seq->head;
    while (cur) {
        if (cur->data == pos) {
            node_t *node = malloc(sizeof(node_t));
            node->data = data;
            node->next = cur->next;
            cur->next = node;
            ++(seq->len);
            return data;
        }
        cur = cur->next;
    }
    return NULL;
}